

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::code_coefficients_pass_one(jpeg_encoder *this,int component_num)

{
  uint32 *puVar1;
  short sVar2;
  ushort uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint32 (*pauVar8) [256];
  long lVar9;
  int iVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (component_num < 3) {
    uVar6 = (ulong)(component_num != 0);
    sVar2 = this->m_coefficient_array[0];
    iVar10 = this->m_last_dc_val[component_num];
    this->m_last_dc_val[component_num] = (int)sVar2;
    iVar7 = 0;
    uVar12 = sVar2 - iVar10;
    if (uVar12 == 0) {
      lVar9 = 0;
    }
    else {
      uVar5 = -uVar12;
      if (0 < (int)uVar12) {
        uVar5 = uVar12;
      }
      lVar9 = 0;
      uVar13 = (ulong)uVar5;
      do {
        uVar13 = uVar13 >> 1;
        lVar9 = lVar9 + 1;
        bVar4 = 1 < uVar5;
        uVar5 = (uint)uVar13;
      } while (bVar4);
    }
    pauVar8 = this->m_huff_count + uVar6 + 2;
    puVar1 = this->m_huff_count[uVar6] + lVar9;
    *puVar1 = *puVar1 + 1;
    lVar9 = 1;
    do {
      uVar3 = this->m_coefficient_array[lVar9];
      if (uVar3 == 0) {
        iVar7 = iVar7 + 1;
      }
      else {
        if (0xf < iVar7) {
          iVar10 = 0x1f;
          if (iVar7 < 0x1f) {
            iVar10 = iVar7;
          }
          uVar12 = (iVar7 - iVar10) + 0xf;
          iVar7 = (iVar7 - (uVar12 & 0xfffffff0)) + -0x10;
          this->m_huff_count[uVar6 + 2][0xf0] =
               (uVar12 >> 4) + this->m_huff_count[uVar6 + 2][0xf0] + 1;
        }
        uVar11 = -uVar3;
        if (0 < (short)uVar3) {
          uVar11 = uVar3;
        }
        iVar10 = 1;
        if (1 < uVar11) {
          uVar12 = (uint)uVar11;
          do {
            iVar10 = iVar10 + 1;
            bVar4 = 3 < uVar12;
            uVar12 = uVar12 >> 1;
          } while (bVar4);
        }
        (*pauVar8)[iVar7 * 0x10 + iVar10] = (*pauVar8)[iVar7 * 0x10 + iVar10] + 1;
        iVar7 = 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x40);
    if (iVar7 != 0) {
      (*pauVar8)[0] = (*pauVar8)[0] + 1;
    }
  }
  return;
}

Assistant:

void jpeg_encoder::code_coefficients_pass_one(int component_num) {
  if (component_num >= 3)
    return;  // just to shut up static analysis
  int i, run_len, nbits, temp1;
  int16* src = m_coefficient_array;
  uint32 *dc_count = component_num ? m_huff_count[0 + 1] : m_huff_count[0 + 0], *ac_count = component_num ? m_huff_count[2 + 1] : m_huff_count[2 + 0];

  temp1 = src[0] - m_last_dc_val[component_num];
  m_last_dc_val[component_num] = src[0];
  if (temp1 < 0)
    temp1 = -temp1;

  nbits = 0;
  while (temp1) {
    nbits++;
    temp1 >>= 1;
  }

  dc_count[nbits]++;
  for (run_len = 0, i = 1; i < 64; i++) {
    if ((temp1 = m_coefficient_array[i]) == 0)
      run_len++;
    else {
      while (run_len >= 16) {
        ac_count[0xF0]++;
        run_len -= 16;
      }
      if (temp1 < 0)
        temp1 = -temp1;
      nbits = 1;
      while (temp1 >>= 1)
        nbits++;
      ac_count[(run_len << 4) + nbits]++;
      run_len = 0;
    }
  }
  if (run_len)
    ac_count[0]++;
}